

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O1

ostream * operator<<(ostream *o,Employee *e)

{
  string *psVar1;
  ostream *poVar2;
  Address *a;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"name-> ",7);
  psVar1 = Person::getName_abi_cxx11_(&e->super_Person);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", id-> ",7);
  psVar1 = Person::getId_abi_cxx11_(&e->super_Person);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", address-> ",0xc);
  a = Person::getAddress(&e->super_Person);
  poVar2 = operator<<(poVar2,a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"hour work= ",0xb);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,e->hourWork);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", salary per hour= ",0x13);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,e->salaryPerHour);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", work to do= ",0xe);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,e->workToDo);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", work done= ",0xd);
  std::ostream::operator<<((ostream *)poVar2,e->workDone);
  return o;
}

Assistant:

std::ostream &operator<<(ostream &o, const Employee &e) {

    o << "name-> " << e.getName() << ", id-> " << e.getId() << ", address-> " << e.getAddress() << endl
        << "hour work= " << e.getHourWork() << ", salary per hour= " << e.getSalaryPerHour() << ", work to do= " << e.getWorkToDo() << ", work done= " << e.getWorkDone();
    return o;
}